

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O3

QListWidgetItem * __thiscall QListWidget::takeItem(QListWidget *this,int row)

{
  long lVar1;
  int iVar2;
  QListModel *this_00;
  QListWidgetItem *pQVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < row) {
    iVar2 = (**(code **)(**(long **)(*(long *)&(this->super_QListView).super_QAbstractItemView.
                                               super_QAbstractScrollArea.super_QFrame.super_QWidget.
                                               field_0x8 + 0x2f8) + 0x78))();
    if (row < iVar2) {
      this_00 = (QListModel *)QMetaObject::cast((QObject *)&QListModel::staticMetaObject);
      pQVar3 = QListModel::take(this_00,row);
      goto LAB_0057d1b6;
    }
  }
  pQVar3 = (QListWidgetItem *)0x0;
LAB_0057d1b6:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QListWidgetItem *QListWidget::takeItem(int row)
{
    Q_D(QListWidget);
    if (row < 0 || row >= d->model->rowCount())
        return nullptr;
    return d->listModel()->take(row);
}